

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xmlXPathRegisterVariableNS
              (xmlXPathContextPtr ctxt,xmlChar *name,xmlChar *ns_uri,xmlXPathObjectPtr value)

{
  xmlHashTablePtr pxVar1;
  xmlXPathObjectPtr value_local;
  xmlChar *ns_uri_local;
  xmlChar *name_local;
  xmlXPathContextPtr ctxt_local;
  
  if (ctxt == (xmlXPathContextPtr)0x0) {
    ctxt_local._4_4_ = -1;
  }
  else if (name == (xmlChar *)0x0) {
    ctxt_local._4_4_ = -1;
  }
  else {
    if (ctxt->varHash == (xmlHashTablePtr)0x0) {
      pxVar1 = xmlHashCreate(0);
      ctxt->varHash = pxVar1;
    }
    if (ctxt->varHash == (xmlHashTablePtr)0x0) {
      ctxt_local._4_4_ = -1;
    }
    else if (value == (xmlXPathObjectPtr)0x0) {
      ctxt_local._4_4_ = xmlHashRemoveEntry2(ctxt->varHash,name,ns_uri,xmlXPathFreeObjectEntry);
    }
    else {
      ctxt_local._4_4_ =
           xmlHashUpdateEntry2(ctxt->varHash,name,ns_uri,value,xmlXPathFreeObjectEntry);
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlXPathRegisterVariableNS(xmlXPathContextPtr ctxt, const xmlChar *name,
			   const xmlChar *ns_uri,
			   xmlXPathObjectPtr value) {
    if (ctxt == NULL)
	return(-1);
    if (name == NULL)
	return(-1);

    if (ctxt->varHash == NULL)
	ctxt->varHash = xmlHashCreate(0);
    if (ctxt->varHash == NULL)
	return(-1);
    if (value == NULL)
        return(xmlHashRemoveEntry2(ctxt->varHash, name, ns_uri,
	                           xmlXPathFreeObjectEntry));
    return(xmlHashUpdateEntry2(ctxt->varHash, name, ns_uri,
			       (void *) value, xmlXPathFreeObjectEntry));
}